

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

void deqp::gls::Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
               (PixelBufferAccess *access,Vector<int,_4> *color,IVec4 *scissorArea)

{
  int y;
  int y_00;
  int x;
  int x_00;
  
  for (y_00 = 0; y_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]; x_00 = x_00 + 1)
    {
      if ((((y_00 < scissorArea->m_data[1]) ||
           (scissorArea->m_data[1] + scissorArea->m_data[3] <= y_00)) ||
          (x_00 < scissorArea->m_data[0])) ||
         (scissorArea->m_data[0] + scissorArea->m_data[2] <= x_00)) {
        tcu::PixelBufferAccess::setPixel(access,color,x_00,y_00,0);
      }
    }
  }
  return;
}

Assistant:

void clearEdges (const tcu::PixelBufferAccess& access, const T& color, const IVec4& scissorArea)
{
	for (int y = 0; y < access.getHeight(); y++)
	for (int x = 0; x < access.getWidth(); x++)
	{
		if (y < scissorArea.y() ||
			y >= scissorArea.y() + scissorArea.w() ||
			x < scissorArea.x() ||
			x >= scissorArea.x()+ scissorArea.z())
			access.setPixel(color, x, y);
	}
}